

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::get_hash_for_shader_module
          (Impl *this,VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info,Hash *hash)

{
  const_iterator cVar1;
  VkShaderModuleIdentifierEXT ident;
  
  ident.pNext = (void *)0x0;
  ident.identifier[0xc] = '\0';
  ident.identifier[0xd] = '\0';
  ident.identifier[0xe] = '\0';
  ident.identifier[0xf] = '\0';
  ident.identifier[0x10] = '\0';
  ident.identifier[0x11] = '\0';
  ident.identifier[0x12] = '\0';
  ident.identifier[0x13] = '\0';
  ident.identifier[0x14] = '\0';
  ident.identifier[0x15] = '\0';
  ident.identifier[0x16] = '\0';
  ident.identifier[0x17] = '\0';
  ident.identifier[0x18] = '\0';
  ident.identifier[0x19] = '\0';
  ident.identifier[0x1a] = '\0';
  ident.identifier[0x1b] = '\0';
  ident.identifier[4] = '\0';
  ident.identifier[5] = '\0';
  ident.identifier[6] = '\0';
  ident.identifier[7] = '\0';
  ident.identifier[8] = '\0';
  ident.identifier[9] = '\0';
  ident.identifier[10] = '\0';
  ident.identifier[0xb] = '\0';
  ident.identifier[0x1c] = '\0';
  ident.identifier[0x1d] = '\0';
  ident.identifier[0x1e] = '\0';
  ident.identifier[0x1f] = '\0';
  ident._52_4_ = 0;
  ident.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
  ident._4_4_ = 0;
  ident._16_8_ = 0x20;
  if (info->identifierSize < 0x20) {
    ident._16_8_ = ZEXT48(info->identifierSize);
  }
  memcpy(ident.identifier,info->pIdentifier,ident._16_8_);
  cVar1 = std::
          _Hashtable<VkShaderModuleIdentifierEXT,_std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::hash<VkShaderModuleIdentifierEXT>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->identifier_to_module)._M_h,&ident);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    *hash = *(Hash *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>
                            ._M_cur + 0x40);
  }
  return cVar1.
         super__Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::Impl::get_hash_for_shader_module(
		const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info, Hash *hash) const
{
	VkShaderModuleIdentifierEXT ident = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
	ident.identifierSize = std::min<uint32_t>(info->identifierSize, VK_MAX_SHADER_MODULE_IDENTIFIER_SIZE_EXT);
	memcpy(ident.identifier, info->pIdentifier, ident.identifierSize);
	auto itr = identifier_to_module.find(ident);

	if (itr == identifier_to_module.end())
	{
		return false;
	}
	else
	{
		*hash = api_object_cast<Hash>(itr->second);
		return true;
	}
}